

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  short *psVar1;
  cubeb_log_level cVar2;
  cubeb_log_callback p_Var3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t out_len;
  uint32_t in_len;
  undefined8 local_38;
  
  uVar4 = (ulong)(this->super_processor).channels;
  if ((this->resampling_out_buffer).capacity_ < uVar4 * output_frame_count) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar4 * output_frame_count);
    uVar4 = (ulong)(this->super_processor).channels;
  }
  local_38 = CONCAT44((int)((this->resampling_in_buffer).length_ / uVar4),(int)output_frame_count);
  speex_resample(this,(this->resampling_in_buffer).data_,(uint32_t *)((long)&local_38 + 4),
                 (this->resampling_out_buffer).data_,(uint32_t *)&local_38);
  if ((local_38 & 0xffffffff) < output_frame_count) {
    cVar2 = cubeb_log_get_level();
    if (1 < (int)cVar2) {
      p_Var3 = cubeb_log_get_callback();
      if (p_Var3 != (cubeb_log_callback)0x0) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x113,
                           "underrun during resampling: got %u frames, expected %zu",
                           local_38 & 0xffffffff,output_frame_count);
      }
    }
    psVar1 = (this->resampling_out_buffer).data_;
    uVar5 = (this->super_processor).channels;
    uVar4 = (ulong)uVar5;
    for (uVar5 = (uint32_t)local_38 * uVar5; uVar6 = (ulong)uVar5,
        uVar6 <= output_frame_count * uVar4 && output_frame_count * uVar4 - uVar6 != 0;
        uVar5 = uVar5 + 1) {
      psVar1[uVar6] = 0;
    }
  }
  else {
    uVar4 = (ulong)(this->super_processor).channels;
  }
  auto_array<short>::pop(&this->resampling_in_buffer,(short *)0x0,(local_38 >> 0x20) * uVar4);
  *input_frames_used = local_38 >> 0x20;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() <
        frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu",
           (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T * data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len);
           i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }